

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_msl.cpp
# Opt level: O0

void __thiscall spirv_cross::CompilerMSL::emit_mesh_outputs(CompilerMSL *this)

{
  bool bVar1;
  uint32_t uVar2;
  uint32_t uVar3;
  uint32_t uVar4;
  SPIREntryPoint *pSVar5;
  SPIRType *pSVar6;
  size_t sVar7;
  SPIRVariable *pSVar8;
  SPIRType *pSVar9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_350;
  string local_330;
  string local_310;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2b0;
  uint32_t local_290;
  uint32_t local_28c;
  undefined1 local_288 [8];
  string access_1;
  BuiltIn builtin_1;
  SPIRType *orig_type_1;
  SPIRVariable *orig_1;
  uint32_t orig_id_1;
  uint32_t orig_var_1;
  uint32_t index_1;
  SPIRType *type_prim;
  string local_218;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1f8;
  string local_1d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_198;
  string local_178;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_158;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_138;
  uint32_t local_114;
  uint32_t local_110;
  uint32_t local_10c;
  uint32_t orig_index;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8;
  uint32_t local_88;
  uint32_t local_74;
  undefined1 local_70 [8];
  string access;
  BuiltIn builtin;
  SPIRType *orig_type;
  SPIRVariable *orig;
  uint32_t orig_id;
  uint32_t orig_var;
  uint32_t index;
  SPIRType *type_vert;
  uint32_t num_invocations;
  SPIREntryPoint *mode;
  CompilerMSL *this_local;
  
  pSVar5 = Compiler::get_entry_point((Compiler *)this);
  type_vert._4_4_ = 0;
  if ((((pSVar5->workgroup_size).id_x == 0) && ((pSVar5->workgroup_size).id_y == 0)) &&
     ((pSVar5->workgroup_size).id_z == 0)) {
    type_vert._4_4_ =
         (pSVar5->workgroup_size).x * (pSVar5->workgroup_size).y * (pSVar5->workgroup_size).z;
  }
  CompilerGLSL::statement<char_const(&)[49]>
            (&this->super_CompilerGLSL,
             (char (*) [49])"threadgroup_barrier(mem_flags::mem_threadgroup);");
  CompilerGLSL::statement<char_const(&)[25]>
            (&this->super_CompilerGLSL,(char (*) [25])"if (spvMeshSizes.y == 0)");
  CompilerGLSL::begin_scope(&this->super_CompilerGLSL);
  CompilerGLSL::statement<char_const(&)[8]>(&this->super_CompilerGLSL,(char (*) [8])0x5abe1c);
  CompilerGLSL::end_scope(&this->super_CompilerGLSL);
  CompilerGLSL::statement<char_const(&)[45]>
            (&this->super_CompilerGLSL,(char (*) [45])"spvMesh.set_primitive_count(spvMeshSizes.y);"
            );
  CompilerGLSL::statement<char_const(&)[109]>
            (&this->super_CompilerGLSL,
             (char (*) [109])
             "const uint spvThreadCount [[maybe_unused]] = (gl_WorkGroupSize.x * gl_WorkGroupSize.y * gl_WorkGroupSize.z);"
            );
  uVar2 = TypedID::operator_cast_to_unsigned_int((TypedID *)&this->mesh_out_per_vertex);
  if (uVar2 != 0) {
    uVar2 = TypedID::operator_cast_to_unsigned_int((TypedID *)&this->mesh_out_per_vertex);
    pSVar6 = Compiler::get<spirv_cross::SPIRType>((Compiler *)this,uVar2);
    if (type_vert._4_4_ < pSVar5->output_vertices) {
      CompilerGLSL::statement<char_const(&)[92]>
                (&this->super_CompilerGLSL,
                 (char (*) [92])
                 "for (uint spvVI = gl_LocalInvocationIndex; spvVI < spvMeshSizes.x; spvVI += spvThreadCount)"
                );
    }
    else {
      CompilerGLSL::statement<char_const(&)[44]>
                (&this->super_CompilerGLSL,
                 (char (*) [44])"const uint spvVI = gl_LocalInvocationIndex;");
      CompilerGLSL::statement<char_const(&)[46]>
                (&this->super_CompilerGLSL,
                 (char (*) [46])"if (gl_LocalInvocationIndex < spvMeshSizes.x)");
    }
    CompilerGLSL::begin_scope(&this->super_CompilerGLSL);
    CompilerGLSL::statement<char_const(&)[24]>
              (&this->super_CompilerGLSL,(char (*) [24])"spvPerVertex spvV = {};");
    for (orig_id = 0;
        sVar7 = VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>::size
                          (&(pSVar6->member_types).
                            super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>),
        orig_id < (uint)sVar7; orig_id = orig_id + 1) {
      uVar2 = TypedID::operator_cast_to_unsigned_int((TypedID *)&(pSVar6->super_IVariant).self);
      uVar2 = Compiler::get_extended_member_decoration
                        ((Compiler *)this,uVar2,orig_id,SPIRVCrossDecorationInterfaceOrigID);
      uVar3 = TypedID::operator_cast_to_unsigned_int((TypedID *)&(pSVar6->super_IVariant).self);
      uVar3 = Compiler::get_extended_member_decoration
                        ((Compiler *)this,uVar3,orig_id,SPIRVCrossDecorationInterfaceMemberIndex);
      if ((uVar2 != 0) || (uVar3 != 0xffffffff)) {
        pSVar8 = Compiler::get<spirv_cross::SPIRVariable>((Compiler *)this,uVar2);
        uVar4 = TypedID::operator_cast_to_unsigned_int
                          ((TypedID *)&(pSVar8->super_IVariant).field_0xc);
        pSVar9 = Compiler::get<spirv_cross::SPIRType>((Compiler *)this,uVar4);
        access.field_2._12_4_ = 0x7fffffff;
        ::std::__cxx11::string::string((string *)local_70);
        if (pSVar9->basetype == Struct) {
          local_74 = (uint32_t)
                     TypedID::operator_cast_to_TypedID((TypedID *)&(pSVar9->super_IVariant).self);
          bVar1 = Compiler::has_member_decoration((Compiler *)this,(TypeID)local_74,uVar3,BuiltIn);
          if (bVar1) {
            local_88 = (uint32_t)
                       TypedID::operator_cast_to_TypedID((TypedID *)&(pSVar9->super_IVariant).self);
            access.field_2._12_4_ =
                 Compiler::get_member_decoration((Compiler *)this,(TypeID)local_88,uVar3,BuiltIn);
          }
          if (((uint)access.field_2._12_4_ < 2) ||
             (access.field_2._12_4_ == 3 || access.field_2._12_4_ == 4)) {
            (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x14])
                      (&local_c8,this,(ulong)(uint)access.field_2._12_4_,3);
            ::std::operator+(&local_a8,".",&local_c8);
            ::std::__cxx11::string::operator=((string *)local_70,(string *)&local_a8);
            ::std::__cxx11::string::~string((string *)&local_a8);
            ::std::__cxx11::string::~string((string *)&local_c8);
          }
          else {
            CompilerGLSL::to_member_name_abi_cxx11_
                      ((string *)&orig_index,&this->super_CompilerGLSL,pSVar9,uVar3);
            ::std::operator+(&local_e8,".",
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             &orig_index);
            ::std::__cxx11::string::operator=((string *)local_70,(string *)&local_e8);
            ::std::__cxx11::string::~string((string *)&local_e8);
            ::std::__cxx11::string::~string((string *)&orig_index);
          }
          local_10c = (uint32_t)
                      TypedID::operator_cast_to_TypedID((TypedID *)&(pSVar6->super_IVariant).self);
          bVar1 = Compiler::has_member_decoration
                            ((Compiler *)this,(TypeID)local_10c,orig_id,DecorationIndex);
          if (bVar1) {
            local_114 = (uint32_t)
                        TypedID::operator_cast_to_TypedID((TypedID *)&(pSVar6->super_IVariant).self)
            ;
            local_110 = Compiler::get_member_decoration
                                  ((Compiler *)this,(TypeID)local_114,orig_id,DecorationIndex);
            ::std::__cxx11::to_string(&local_178,local_110);
            ::std::operator+(&local_158,"[",&local_178);
            ::std::operator+(&local_138,&local_158,"]");
            ::std::__cxx11::string::operator+=((string *)local_70,(string *)&local_138);
            ::std::__cxx11::string::~string((string *)&local_138);
            ::std::__cxx11::string::~string((string *)&local_158);
            ::std::__cxx11::string::~string((string *)&local_178);
            (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x14])
                      (&local_198,this,(ulong)(uint)access.field_2._12_4_,3);
            (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[6])
                      (&local_1b8,this,(ulong)uVar2,1);
            CompilerGLSL::
            statement<char_const(&)[6],std::__cxx11::string,char_const(&)[2],unsigned_int_const&,char_const(&)[5],std::__cxx11::string,char_const(&)[8],std::__cxx11::string&,char_const(&)[2]>
                      (&this->super_CompilerGLSL,(char (*) [6])"spvV.",&local_198,
                       (char (*) [2])0x5978ea,&local_110,(char (*) [5])0x5abcd7,&local_1b8,
                       (char (*) [8])"[spvVI]",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_70
                       ,(char (*) [2])0x5abb6c);
            ::std::__cxx11::string::~string((string *)&local_1b8);
            ::std::__cxx11::string::~string((string *)&local_198);
          }
        }
        CompilerGLSL::to_member_name_abi_cxx11_(&local_1d8,&this->super_CompilerGLSL,pSVar6,orig_id)
        ;
        (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[6])
                  (&local_1f8,this,(ulong)uVar2,1);
        CompilerGLSL::
        statement<char_const(&)[6],std::__cxx11::string,char_const(&)[4],std::__cxx11::string,char_const(&)[8],std::__cxx11::string&,char_const(&)[2]>
                  (&this->super_CompilerGLSL,(char (*) [6])"spvV.",&local_1d8,(char (*) [4])0x5abcd8
                   ,&local_1f8,(char (*) [8])"[spvVI]",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_70,
                   (char (*) [2])0x5abb6c);
        ::std::__cxx11::string::~string((string *)&local_1f8);
        ::std::__cxx11::string::~string((string *)&local_1d8);
        if ((((this->super_CompilerGLSL).options.vertex.flip_vert_y & 1U) != 0) &&
           (access.field_2._12_4_ == 0)) {
          CompilerGLSL::to_member_name_abi_cxx11_
                    (&local_218,&this->super_CompilerGLSL,pSVar6,orig_id);
          CompilerGLSL::to_member_name_abi_cxx11_
                    ((string *)&type_prim,&this->super_CompilerGLSL,pSVar6,orig_id);
          CompilerGLSL::
          statement<char_const(&)[6],std::__cxx11::string,char_const(&)[8],char_const(&)[6],std::__cxx11::string,char_const(&)[5],char_const(&)[31]>
                    (&this->super_CompilerGLSL,(char (*) [6])"spvV.",&local_218,
                     (char (*) [8])".y = -(",(char (*) [6])"spvV.",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&type_prim
                     ,(char (*) [5])0x5ab8ce,(char (*) [31])"    // Invert Y-axis for Metal");
          ::std::__cxx11::string::~string((string *)&type_prim);
          ::std::__cxx11::string::~string((string *)&local_218);
        }
        ::std::__cxx11::string::~string((string *)local_70);
      }
    }
    CompilerGLSL::statement<char_const(&)[33]>
              (&this->super_CompilerGLSL,(char (*) [33])"spvMesh.set_vertex(spvVI, spvV);");
    CompilerGLSL::end_scope(&this->super_CompilerGLSL);
  }
  uVar2 = TypedID::operator_cast_to_unsigned_int((TypedID *)&this->mesh_out_per_primitive);
  if ((uVar2 != 0) || (this->builtin_mesh_primitive_indices_id != 0)) {
    if (type_vert._4_4_ < pSVar5->output_primitives) {
      CompilerGLSL::statement<char_const(&)[92]>
                (&this->super_CompilerGLSL,
                 (char (*) [92])
                 "for (uint spvPI = gl_LocalInvocationIndex; spvPI < spvMeshSizes.y; spvPI += spvThreadCount)"
                );
    }
    else {
      CompilerGLSL::statement<char_const(&)[44]>
                (&this->super_CompilerGLSL,
                 (char (*) [44])"const uint spvPI = gl_LocalInvocationIndex;");
      CompilerGLSL::statement<char_const(&)[46]>
                (&this->super_CompilerGLSL,
                 (char (*) [46])"if (gl_LocalInvocationIndex < spvMeshSizes.y)");
    }
    CompilerGLSL::begin_scope(&this->super_CompilerGLSL);
    if (this->builtin_mesh_primitive_indices_id != 0) {
      bVar1 = Bitset::get(&pSVar5->flags,0x14b2);
      if (bVar1) {
        CompilerGLSL::statement<char_const(&)[77]>
                  (&this->super_CompilerGLSL,
                   (char (*) [77])
                   "spvMesh.set_index(spvPI * 3u + 0u, gl_PrimitiveTriangleIndicesEXT[spvPI].x);");
        CompilerGLSL::statement<char_const(&)[77]>
                  (&this->super_CompilerGLSL,
                   (char (*) [77])
                   "spvMesh.set_index(spvPI * 3u + 1u, gl_PrimitiveTriangleIndicesEXT[spvPI].y);");
        CompilerGLSL::statement<char_const(&)[77]>
                  (&this->super_CompilerGLSL,
                   (char (*) [77])
                   "spvMesh.set_index(spvPI * 3u + 2u, gl_PrimitiveTriangleIndicesEXT[spvPI].z);");
      }
      else {
        bVar1 = Bitset::get(&pSVar5->flags,0x1495);
        if (bVar1) {
          CompilerGLSL::statement<char_const(&)[73]>
                    (&this->super_CompilerGLSL,
                     (char (*) [73])
                     "spvMesh.set_index(spvPI * 2u + 0u, gl_PrimitiveLineIndicesEXT[spvPI].x);");
          CompilerGLSL::statement<char_const(&)[73]>
                    (&this->super_CompilerGLSL,
                     (char (*) [73])
                     "spvMesh.set_index(spvPI * 2u + 1u, gl_PrimitiveLineIndicesEXT[spvPI].y);");
        }
        else {
          CompilerGLSL::statement<char_const(&)[62]>
                    (&this->super_CompilerGLSL,
                     (char (*) [62])"spvMesh.set_index(spvPI, gl_PrimitivePointIndicesEXT[spvPI]);")
          ;
        }
      }
    }
    uVar2 = TypedID::operator_cast_to_unsigned_int((TypedID *)&this->mesh_out_per_primitive);
    if (uVar2 != 0) {
      uVar2 = TypedID::operator_cast_to_unsigned_int((TypedID *)&this->mesh_out_per_primitive);
      pSVar6 = Compiler::get<spirv_cross::SPIRType>((Compiler *)this,uVar2);
      CompilerGLSL::statement<char_const(&)[27]>
                (&this->super_CompilerGLSL,(char (*) [27])"spvPerPrimitive spvP = {};");
      for (orig_id_1 = 0;
          sVar7 = VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>::size
                            (&(pSVar6->member_types).
                              super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>),
          orig_id_1 < (uint)sVar7; orig_id_1 = orig_id_1 + 1) {
        uVar2 = TypedID::operator_cast_to_unsigned_int((TypedID *)&(pSVar6->super_IVariant).self);
        uVar2 = Compiler::get_extended_member_decoration
                          ((Compiler *)this,uVar2,orig_id_1,SPIRVCrossDecorationInterfaceOrigID);
        uVar3 = TypedID::operator_cast_to_unsigned_int((TypedID *)&(pSVar6->super_IVariant).self);
        uVar3 = Compiler::get_extended_member_decoration
                          ((Compiler *)this,uVar3,orig_id_1,SPIRVCrossDecorationInterfaceMemberIndex
                          );
        pSVar8 = Compiler::get<spirv_cross::SPIRVariable>((Compiler *)this,uVar2);
        uVar4 = TypedID::operator_cast_to_unsigned_int
                          ((TypedID *)&(pSVar8->super_IVariant).field_0xc);
        pSVar9 = Compiler::get<spirv_cross::SPIRType>((Compiler *)this,uVar4);
        access_1.field_2._12_4_ = 0x7fffffff;
        ::std::__cxx11::string::string((string *)local_288);
        if (pSVar9->basetype == Struct) {
          local_28c = (uint32_t)
                      TypedID::operator_cast_to_TypedID((TypedID *)&(pSVar9->super_IVariant).self);
          bVar1 = Compiler::has_member_decoration((Compiler *)this,(TypeID)local_28c,uVar3,BuiltIn);
          if (bVar1) {
            local_290 = (uint32_t)
                        TypedID::operator_cast_to_TypedID((TypedID *)&(pSVar9->super_IVariant).self)
            ;
            access_1.field_2._12_4_ =
                 Compiler::get_member_decoration((Compiler *)this,(TypeID)local_290,uVar3,BuiltIn);
          }
          if ((((access_1.field_2._12_4_ == 7) || (access_1.field_2._12_4_ - 9 < 2)) ||
              (access_1.field_2._12_4_ == 0x1150)) || (access_1.field_2._12_4_ == 0x14b3)) {
            (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x14])
                      (&local_2d0,this,(ulong)(uint)access_1.field_2._12_4_,3);
            ::std::operator+(&local_2b0,".",&local_2d0);
            ::std::__cxx11::string::operator=((string *)local_288,(string *)&local_2b0);
            ::std::__cxx11::string::~string((string *)&local_2b0);
            ::std::__cxx11::string::~string((string *)&local_2d0);
          }
          else {
            CompilerGLSL::to_member_name_abi_cxx11_
                      (&local_310,&this->super_CompilerGLSL,pSVar9,uVar3);
            ::std::operator+(&local_2f0,".",&local_310);
            ::std::__cxx11::string::operator=((string *)local_288,(string *)&local_2f0);
            ::std::__cxx11::string::~string((string *)&local_2f0);
            ::std::__cxx11::string::~string((string *)&local_310);
          }
        }
        CompilerGLSL::to_member_name_abi_cxx11_
                  (&local_330,&this->super_CompilerGLSL,pSVar6,orig_id_1);
        (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[6])
                  (&local_350,this,(ulong)uVar2,1);
        CompilerGLSL::
        statement<char_const(&)[6],std::__cxx11::string,char_const(&)[4],std::__cxx11::string,char_const(&)[8],std::__cxx11::string&,char_const(&)[2]>
                  (&this->super_CompilerGLSL,(char (*) [6])"spvP.",&local_330,(char (*) [4])0x5abcd8
                   ,&local_350,(char (*) [8])"[spvPI]",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_288,
                   (char (*) [2])0x5abb6c);
        ::std::__cxx11::string::~string((string *)&local_350);
        ::std::__cxx11::string::~string((string *)&local_330);
        ::std::__cxx11::string::~string((string *)local_288);
      }
      CompilerGLSL::statement<char_const(&)[36]>
                (&this->super_CompilerGLSL,(char (*) [36])"spvMesh.set_primitive(spvPI, spvP);");
    }
    CompilerGLSL::end_scope(&this->super_CompilerGLSL);
  }
  return;
}

Assistant:

void CompilerMSL::emit_mesh_outputs()
{
	auto &mode = get_entry_point();

	// predefined thread count or zero, if specialization constant is in use
	uint32_t num_invocations = 0;
	if (mode.workgroup_size.id_x == 0 && mode.workgroup_size.id_y == 0 && mode.workgroup_size.id_z == 0)
		num_invocations = mode.workgroup_size.x * mode.workgroup_size.y * mode.workgroup_size.z;

	statement("threadgroup_barrier(mem_flags::mem_threadgroup);");
	statement("if (spvMeshSizes.y == 0)");
	begin_scope();
	statement("return;");
	end_scope();
	statement("spvMesh.set_primitive_count(spvMeshSizes.y);");

	statement("const uint spvThreadCount [[maybe_unused]] = (gl_WorkGroupSize.x * gl_WorkGroupSize.y * gl_WorkGroupSize.z);");

	if (mesh_out_per_vertex != 0)
	{
		auto &type_vert = get<SPIRType>(mesh_out_per_vertex);

		if (num_invocations < mode.output_vertices)
		{
			statement("for (uint spvVI = gl_LocalInvocationIndex; spvVI < spvMeshSizes.x; spvVI += spvThreadCount)");
		}
		else
		{
			statement("const uint spvVI = gl_LocalInvocationIndex;");
			statement("if (gl_LocalInvocationIndex < spvMeshSizes.x)");
		}

		begin_scope();

		statement("spvPerVertex spvV = {};");
		for (uint32_t index = 0; index < uint32_t(type_vert.member_types.size()); ++index)
		{
			uint32_t orig_var = get_extended_member_decoration(type_vert.self, index, SPIRVCrossDecorationInterfaceOrigID);
			uint32_t orig_id = get_extended_member_decoration(type_vert.self, index, SPIRVCrossDecorationInterfaceMemberIndex);

			// Clip/cull distances are special-case
			if (orig_var == 0 && orig_id == (~0u))
				continue;

			auto &orig = get<SPIRVariable>(orig_var);
			auto &orig_type = get<SPIRType>(orig.basetype);

			// FIXME: Need to deal with complex composite IO types. These may need extra unroll, etc.

			BuiltIn builtin = BuiltInMax;
			std::string access;
			if (orig_type.basetype == SPIRType::Struct)
			{
				if (has_member_decoration(orig_type.self, orig_id, DecorationBuiltIn))
					builtin = BuiltIn(get_member_decoration(orig_type.self, orig_id, DecorationBuiltIn));

				switch (builtin)
				{
				case BuiltInPosition:
				case BuiltInPointSize:
				case BuiltInClipDistance:
				case BuiltInCullDistance:
					access = "." + builtin_to_glsl(builtin, StorageClassOutput);
					break;
				default:
					access = "." + to_member_name(orig_type, orig_id);
					break;
				}

				if (has_member_decoration(type_vert.self, index, DecorationIndex))
				{
					// Declare the Clip/CullDistance as [[user(clip/cullN)]].
					const uint32_t orig_index = get_member_decoration(type_vert.self, index, DecorationIndex);
					access += "[" + to_string(orig_index) + "]";
					statement("spvV.", builtin_to_glsl(builtin, StorageClassOutput), "[", orig_index, "] = ", to_name(orig_var), "[spvVI]", access, ";");
				}
			}

			statement("spvV.", to_member_name(type_vert, index), " = ", to_name(orig_var), "[spvVI]", access, ";");
			if (options.vertex.flip_vert_y && builtin == BuiltInPosition)
			{
				statement("spvV.", to_member_name(type_vert, index), ".y = -(", "spvV.",
				          to_member_name(type_vert, index), ".y);", "    // Invert Y-axis for Metal");
			}
		}
		statement("spvMesh.set_vertex(spvVI, spvV);");
		end_scope();
	}

	if (mesh_out_per_primitive != 0 || builtin_mesh_primitive_indices_id != 0)
	{
		if (num_invocations < mode.output_primitives)
		{
			statement("for (uint spvPI = gl_LocalInvocationIndex; spvPI < spvMeshSizes.y; spvPI += spvThreadCount)");
		}
		else
		{
			statement("const uint spvPI = gl_LocalInvocationIndex;");
			statement("if (gl_LocalInvocationIndex < spvMeshSizes.y)");
		}

		// FIXME: Need to deal with complex composite IO types. These may need extra unroll, etc.

		begin_scope();

		if (builtin_mesh_primitive_indices_id != 0)
		{
			if (mode.flags.get(ExecutionModeOutputTrianglesEXT))
			{
				statement("spvMesh.set_index(spvPI * 3u + 0u, gl_PrimitiveTriangleIndicesEXT[spvPI].x);");
				statement("spvMesh.set_index(spvPI * 3u + 1u, gl_PrimitiveTriangleIndicesEXT[spvPI].y);");
				statement("spvMesh.set_index(spvPI * 3u + 2u, gl_PrimitiveTriangleIndicesEXT[spvPI].z);");
			}
			else if (mode.flags.get(ExecutionModeOutputLinesEXT))
			{
				statement("spvMesh.set_index(spvPI * 2u + 0u, gl_PrimitiveLineIndicesEXT[spvPI].x);");
				statement("spvMesh.set_index(spvPI * 2u + 1u, gl_PrimitiveLineIndicesEXT[spvPI].y);");
			}
			else
			{
				statement("spvMesh.set_index(spvPI, gl_PrimitivePointIndicesEXT[spvPI]);");
			}
		}

		if (mesh_out_per_primitive != 0)
		{
			auto &type_prim = get<SPIRType>(mesh_out_per_primitive);
			statement("spvPerPrimitive spvP = {};");
			for (uint32_t index = 0; index < uint32_t(type_prim.member_types.size()); ++index)
			{
				uint32_t orig_var =
						get_extended_member_decoration(type_prim.self, index, SPIRVCrossDecorationInterfaceOrigID);
				uint32_t orig_id =
						get_extended_member_decoration(type_prim.self, index, SPIRVCrossDecorationInterfaceMemberIndex);
				auto &orig = get<SPIRVariable>(orig_var);
				auto &orig_type = get<SPIRType>(orig.basetype);

				BuiltIn builtin = BuiltInMax;
				std::string access;
				if (orig_type.basetype == SPIRType::Struct)
				{
					if (has_member_decoration(orig_type.self, orig_id, DecorationBuiltIn))
						builtin = BuiltIn(get_member_decoration(orig_type.self, orig_id, DecorationBuiltIn));

					switch (builtin)
					{
					case BuiltInPrimitiveId:
					case BuiltInLayer:
					case BuiltInViewportIndex:
					case BuiltInCullPrimitiveEXT:
					case BuiltInPrimitiveShadingRateKHR:
						access = "." + builtin_to_glsl(builtin, StorageClassOutput);
						break;
					default:
						access = "." + to_member_name(orig_type, orig_id);
					}
				}
				statement("spvP.", to_member_name(type_prim, index), " = ", to_name(orig_var), "[spvPI]", access, ";");
			}
			statement("spvMesh.set_primitive(spvPI, spvP);");
		}

		end_scope();
	}
}